

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::convolution_im2col_sgemm_transform_kernel_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int _c;
  int iVar1;
  ulong uVar2;
  uint _w;
  uint _w_00;
  void *pvVar3;
  void *pvVar4;
  int k_1;
  ulong uVar5;
  int k;
  ulong uVar6;
  ulong uVar7;
  int j;
  long lVar8;
  int i;
  ulong uVar9;
  int j_1;
  Mat local_88;
  ulong local_38;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_88,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar1 = inch;
  if (outch < 4) {
    _w_00 = _w;
    _c = outch;
    if (3 < inch) {
      _w_00 = _w * 4;
      iVar1 = inch + ((uint)inch >> 2) * -3;
    }
  }
  else if (inch < 4) {
    _w_00 = _w * 4;
    _c = outch + ((uint)outch >> 2) * -3;
  }
  else {
    _w_00 = _w * 0x10;
    iVar1 = inch + ((uint)inch >> 2) * -3;
    _c = outch + ((uint)outch >> 2) * -3;
  }
  uVar5 = 0;
  Mat::create(kernel_tm,_w_00,iVar1,_c,1,(Allocator *)0x0);
  uVar2 = (ulong)_w;
  uVar7 = uVar5;
  if (3 < outch) {
    do {
      pvVar3 = (void *)((uVar7 >> 2) * kernel_tm->cstep * kernel_tm->elemsize +
                       (long)kernel_tm->data);
      if (inch < 4) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (0 < (int)_w) {
            uVar5 = 0;
            do {
              uVar9 = 0;
              do {
                pvVar4 = pvVar3;
                lVar8 = 0;
                do {
                  *(undefined1 *)((long)pvVar4 + lVar8) =
                       *(undefined1 *)
                        ((long)local_88.data +
                        uVar5 + (uVar6 + lVar8) * (long)local_88.w * local_88.elemsize +
                                local_88.cstep * (uVar9 | uVar7) * local_88.elemsize);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 4);
                uVar9 = uVar9 + 1;
                pvVar3 = (void *)((long)pvVar4 + 4);
              } while (uVar9 != 4);
              uVar5 = uVar5 + 1;
              pvVar3 = (void *)((long)pvVar4 + 4);
            } while (uVar5 != uVar2);
            pvVar3 = (void *)((long)pvVar4 + 4);
          }
          uVar5 = uVar6 + 4;
          lVar8 = uVar6 + 7;
          uVar6 = uVar5;
        } while (lVar8 < inch);
      }
      if ((int)uVar5 < inch) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          if (0 < (int)_w) {
            uVar6 = 0;
            do {
              pvVar4 = pvVar3;
              lVar8 = 0;
              do {
                *(undefined1 *)((long)pvVar4 + lVar8) =
                     *(undefined1 *)
                      ((long)local_88.data +
                      uVar6 + (long)local_88.w * uVar5 * local_88.elemsize +
                              (uVar7 + lVar8) * local_88.cstep * local_88.elemsize);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 4);
              uVar6 = uVar6 + 1;
              pvVar3 = (void *)((long)pvVar4 + 4);
            } while (uVar6 != uVar2);
            pvVar3 = (void *)((long)pvVar4 + 4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)inch);
      }
      uVar5 = uVar7 + 4;
      uVar6 = uVar7 + 7;
      uVar7 = uVar5;
      local_38 = (ulong)_w;
    } while (uVar6 < (uint)outch);
  }
  if ((int)uVar5 < outch) {
    uVar5 = uVar5 & 0xffffffff;
    do {
      pvVar3 = (void *)((ulong)(((uint)uVar5 & 3) + ((uint)(uVar5 >> 2) & 0x3fffffff)) *
                        kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      if (inch < 4) {
        uVar7 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (0 < (int)_w) {
            uVar7 = 0;
            do {
              pvVar4 = pvVar3;
              lVar8 = 0;
              do {
                *(undefined1 *)((long)pvVar4 + lVar8) =
                     *(undefined1 *)
                      ((long)local_88.data +
                      uVar7 + (uVar6 + lVar8) * (long)local_88.w * local_88.elemsize +
                              local_88.cstep * uVar5 * local_88.elemsize);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 4);
              uVar7 = uVar7 + 1;
              pvVar3 = (void *)((long)pvVar4 + 4);
            } while (uVar7 != uVar2);
            pvVar3 = (void *)((long)pvVar4 + 4);
          }
          uVar7 = uVar6 + 4;
          lVar8 = uVar6 + 7;
          uVar6 = uVar7;
        } while (lVar8 < inch);
      }
      if ((int)uVar7 < inch) {
        uVar7 = uVar7 & 0xffffffff;
        do {
          if (0 < (int)_w) {
            uVar6 = 0;
            do {
              *(undefined1 *)((long)pvVar3 + uVar6) =
                   *(undefined1 *)
                    ((long)local_88.data +
                    uVar6 + ((long)local_88.w * uVar7 + local_88.cstep * uVar5) * local_88.elemsize)
              ;
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
            pvVar3 = (void *)((long)pvVar3 + uVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)inch);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)outch);
  }
  if (local_88.refcount != (int *)0x0) {
    LOCK();
    *local_88.refcount = *local_88.refcount + -1;
    UNLOCK();
    if (*local_88.refcount == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

#if __SSE2__
    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
    {
        if (inch >= 4)
            kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4 + outch % 4, (size_t)1u);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + outch % 4, (size_t)1u);
    }
    else
    {
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + inch % 4, outch, (size_t)1u);
        else
            kernel_tm.create(1 * maxk, inch, outch, (size_t)1u);
    }

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 4; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const signed char* k00 = kernel.channel(q).row<const signed char>(p);

                g00[0] = k00[k];

                g00++;
            }
        }
    }
#else  // __SSE2__
    kernel_tm = _kernel.reshape(maxk, inch, outch);
#endif // __SSE2__
}